

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bulk.c
# Opt level: O2

void ecs_bulk_add_type(ecs_world_t *world,ecs_type_t to_add,ecs_filter_t *filter)

{
  ecs_sparse_t *peVar1;
  bool condition;
  undefined8 uVar2;
  long lVar3;
  _Bool _Var4;
  int32_t iVar5;
  ecs_stage_t *peVar6;
  ecs_table_t *table;
  ecs_table_t *dst_table;
  int dense_index;
  ecs_entities_t eVar7;
  code *pcStack_70;
  ecs_entity_t eStack_68;
  undefined1 local_60 [8];
  ecs_entities_t to_add_array;
  undefined1 local_48 [8];
  ecs_entities_t added;
  ecs_world_t *world_local;
  
  pcStack_70 = (code *)0x12f476;
  added._8_8_ = world;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0xa2);
  if (world == (ecs_world_t *)0x0) {
    pcStack_70 = (code *)0x12f6a0;
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,0xa2,"void ecs_bulk_add_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)");
  }
  pcStack_70 = (code *)0x12f4a6;
  _ecs_assert(to_add != (ecs_type_t)0x0,2,(char *)0x0,"to_add != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0xa3);
  to_add_array._8_8_ = to_add;
  if (to_add != (ecs_type_t)0x0) {
    pcStack_70 = (code *)0x12f4bf;
    peVar6 = ecs_get_stage((ecs_world_t **)&added.count);
    dense_index = 0;
    pcStack_70 = (code *)0x12f4f9;
    _ecs_assert(peVar6 == (ecs_stage_t *)(added._8_8_ + 0x5b08),0x23,(char *)0x0,
                "stage == &world->stage",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                ,0xa6);
    if (peVar6 != (ecs_stage_t *)(added._8_8_ + 0x5b08)) {
      pcStack_70 = ecs_bulk_add_entity;
      __assert_fail("stage == &world->stage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                    ,0xa6,"void ecs_bulk_add_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)")
      ;
    }
    pcStack_70 = (code *)0x12f50f;
    eVar7 = ecs_type_to_entities((ecs_type_t)to_add_array._8_8_);
    local_60 = (undefined1  [8])eVar7.array;
    to_add_array.array._0_4_ = eVar7.count;
    lVar3 = -((long)((int)to_add_array.array << 3) + 0xfU & 0xfffffffffffffff0);
    local_48 = (undefined1  [8])((long)&eStack_68 + lVar3);
    added.array._0_4_ = 0;
    peVar1 = *(ecs_sparse_t **)(added._8_8_ + 0x4830);
    *(undefined8 *)((long)&pcStack_70 + lVar3) = 0x12f54b;
    iVar5 = ecs_sparse_count(peVar1);
    if (iVar5 < 1) {
      iVar5 = dense_index;
    }
    do {
      if (iVar5 == dense_index) {
        return;
      }
      peVar1 = *(ecs_sparse_t **)(added._8_8_ + 0x4830);
      *(undefined8 *)((long)&pcStack_70 + lVar3) = 0x12f575;
      table = (ecs_table_t *)_ecs_sparse_get(peVar1,0x80,dense_index);
      uVar2 = added._8_8_;
      if ((table->flags & 1) == 0) {
        *(undefined8 *)((long)&pcStack_70 + lVar3) = 0x12f591;
        _Var4 = ecs_table_match_filter((ecs_world_t *)uVar2,table,filter);
        uVar2 = added._8_8_;
        if (_Var4) {
          *(undefined8 *)((long)&pcStack_70 + lVar3) = 0x12f5ad;
          dst_table = ecs_table_traverse_add
                                ((ecs_world_t *)uVar2,table,(ecs_entities_t *)local_60,
                                 (ecs_entities_t *)local_48);
          condition = (int)added.array <= (int)to_add_array.array;
          *(undefined8 *)((long)&pcStack_70 + lVar3) = 0xc;
          uVar2 = *(undefined8 *)((long)&pcStack_70 + lVar3);
          *(undefined8 *)((long)&pcStack_70 + lVar3) = 0x12f5da;
          _ecs_assert(condition,(int32_t)uVar2,(char *)0x0,"added.count <= to_add_array.count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                      ,0xbe);
          if ((int)to_add_array.array < (int)added.array) {
            *(undefined8 *)((long)&pcStack_70 + lVar3) = 0x12f662;
            __assert_fail("added.count <= to_add_array.count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                          ,0xbe,
                          "void ecs_bulk_add_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)")
            ;
          }
          if ((int)added.array != 0) {
            *(undefined8 *)((long)&pcStack_70 + lVar3) = 0xc;
            uVar2 = *(undefined8 *)((long)&pcStack_70 + lVar3);
            *(undefined8 *)((long)&pcStack_70 + lVar3) = 0x12f60d;
            _ecs_assert(dst_table != (ecs_table_t *)0x0,(int32_t)uVar2,(char *)0x0,
                        "dst_table != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                        ,0xc4);
            uVar2 = added._8_8_;
            if (dst_table == (ecs_table_t *)0x0) {
              *(undefined8 *)((long)&pcStack_70 + lVar3) = 0x12f681;
              __assert_fail("dst_table != ((void*)0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                            ,0xc4,
                            "void ecs_bulk_add_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)"
                           );
            }
            *(undefined8 *)((long)&pcStack_70 + lVar3) = 0x12f628;
            merge_table((ecs_world_t *)uVar2,dst_table,table,(ecs_entities_t *)local_48,
                        (ecs_entities_t *)0x0);
            added.array._0_4_ = 0;
          }
        }
      }
      dense_index = dense_index + 1;
    } while( true );
  }
  pcStack_70 = (code *)0x12f6bf;
  __assert_fail("to_add != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                ,0xa3,"void ecs_bulk_add_type(ecs_world_t *, ecs_type_t, const ecs_filter_t *)");
}

Assistant:

void ecs_bulk_add_type(
    ecs_world_t *world,
    ecs_type_t to_add,
    const ecs_filter_t *filter)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(to_add != NULL, ECS_INVALID_PARAMETER, NULL);
    
    ecs_stage_t *stage = ecs_get_stage(&world);
    ecs_assert(stage == &world->stage, ECS_UNSUPPORTED, NULL);
    (void)stage;

    ecs_entities_t to_add_array = ecs_type_to_entities(to_add);
    ecs_entities_t added = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * to_add_array.count),
        .count = 0
    };

    int32_t i, count = ecs_sparse_count(world->store.tables);
    for (i = 0; i < count; i ++) {
        ecs_table_t *table = ecs_sparse_get(world->store.tables, ecs_table_t, i);

        if (table->flags & EcsTableHasBuiltins) {
            continue;
        }

        if (!ecs_table_match_filter(world, table, filter)) {
            continue;
        }
        
        ecs_table_t *dst_table = ecs_table_traverse_add(
            world, table, &to_add_array, &added);
        
        ecs_assert(added.count <= to_add_array.count, ECS_INTERNAL_ERROR, NULL);

        if (!added.count) {
            continue;
        }

        ecs_assert(dst_table != NULL, ECS_INTERNAL_ERROR, NULL);
        merge_table(world, dst_table, table, &added, NULL);
        added.count = 0;
    }    
}